

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

double __thiscall CLIntercept::log(CLIntercept *this,double __x)

{
  char cVar1;
  ulong *in_RSI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  string logString;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  if ((this->m_Config).SuppressLogging == false) {
    local_40 = local_30;
    std::__cxx11::string::_M_construct((ulong)&local_40,(char)(this->m_Config).LogIndent);
    __x = (double)std::__cxx11::string::_M_append((char *)&local_40,*in_RSI);
    if ((this->m_Config).LogToFile == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&this->m_InterceptLog,local_40,local_38);
      __x = extraout_XMM0_Qa;
      if ((this->m_Config).FlushFiles == true) {
        __x = (double)std::ostream::flush();
      }
    }
    cVar1 = (this->m_Config).LogToDebugger;
    if ((bool)cVar1 == true) {
      syslog(0xe,"%s",local_40);
      cVar1 = (this->m_Config).LogToDebugger;
      __x = extraout_XMM0_Qa_00;
    }
    if (cVar1 == '\0' && (this->m_Config).LogToFile == false) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_40,local_38);
      __x = extraout_XMM0_Qa_01;
    }
    if (local_40 != local_30) {
      operator_delete(local_40);
      __x = extraout_XMM0_Qa_02;
    }
  }
  return __x;
}

Assistant:

void CLIntercept::log( const std::string& s )
{
    if( m_Config.SuppressLogging == false )
    {
        std::string logString( m_Config.LogIndent, ' ' );
        logString += s;
        if( m_Config.LogToFile )
        {
            m_InterceptLog << logString;
            if( m_Config.FlushFiles )
            {
                m_InterceptLog.flush();
            }
        }
        if( m_Config.LogToDebugger )
        {
            OS().OutputDebugString( logString );
        }

        if( ( m_Config.LogToFile == false ) &&
            ( m_Config.LogToDebugger == false ) )
        {
            std::cerr << logString;
        }
    }
}